

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

bool __thiscall opts::Options::parse(Options *this,int argc,char **argv)

{
  size_t *psVar1;
  char *pcVar2;
  undefined1 uVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  mapped_type *ppBVar9;
  mapped_type *ppBVar10;
  _List_node_base *p_Var11;
  iterator iVar12;
  long lVar13;
  long *plVar14;
  ostream *poVar15;
  size_t sVar16;
  ulong uVar17;
  _Base_ptr p_Var18;
  size_type *psVar19;
  mapped_type pBVar20;
  char **ppcVar21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  int iVar24;
  long lVar25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  char *pcVar29;
  map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  short_opts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  long_opts;
  uint local_1ec;
  allocator<char> local_1e5;
  int local_1e4;
  key_type local_1e0;
  char **local_1c0;
  long local_1b8;
  string local_1b0;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  local_190;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_160;
  undefined8 local_158;
  code *local_150;
  code *local_148;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_140;
  undefined8 local_138;
  code *local_130;
  code *local_128;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_120;
  undefined8 local_118;
  code *local_110;
  code *local_108;
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  *local_100;
  undefined8 local_f8;
  code *local_f0;
  code *local_e8;
  _Any_data local_e0;
  code *local_d0;
  code *local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  local_60;
  
  local_190._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190._M_impl.super__Rb_tree_header._M_header;
  local_190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = (this->options).
            super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_1e4 = argc;
  local_1c0 = argv;
  local_190._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var11 != (_List_node_base *)&this->options) {
    do {
      pBVar20 = (mapped_type)p_Var11[1]._M_next;
      if (pBVar20->s != '\0') {
        ppBVar9 = Catch::clara::std::
                  map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                  ::operator[]((map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                                *)&local_190,&pBVar20->s);
        *ppBVar9 = pBVar20;
        pBVar20 = (mapped_type)p_Var11[1]._M_next;
      }
      ppBVar10 = Catch::clara::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                               *)&local_60,&pBVar20->l);
      *ppBVar10 = pBVar20;
      p_Var11 = p_Var11->_M_next;
    } while (p_Var11 != (_List_node_base *)&this->options);
  }
  local_1ec = 1;
  if (1 < local_1e4) {
    ppcVar21 = local_1c0;
    iVar24 = local_1e4;
    do {
      pcVar29 = ppcVar21[(int)local_1ec];
      if (*pcVar29 == '\0') goto LAB_00115509;
      if (*pcVar29 == '-') {
        local_e0._8_8_ = 0;
        local_e0._M_unused._M_object = &local_190;
        local_c8 = Catch::clara::std::
                   _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                   ::_M_invoke;
        local_d0 = Catch::clara::std::
                   _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                   ::_M_manager;
        bVar5 = dashed_non_option(pcVar29,(IsShort *)&local_e0);
        if (local_d0 != (code *)0x0) {
          (*local_d0)(&local_e0,&local_e0,__destroy_functor);
        }
        uVar17 = (ulong)(int)local_1ec;
        pcVar29 = ppcVar21[uVar17];
        if (bVar5) goto LAB_0011547d;
        cVar6 = pcVar29[1];
        if (cVar6 != '-') {
          if (cVar6 != '\0') {
            if (local_190._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              p_Var23 = &local_190._M_impl.super__Rb_tree_header._M_header;
              p_Var4 = local_190._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var18 = p_Var4;
                p_Var22 = p_Var23;
                uVar3 = (undefined1)p_Var18[1]._M_color;
                p_Var23 = p_Var18;
                if ((char)uVar3 < cVar6) {
                  p_Var23 = p_Var22;
                }
                p_Var4 = (&p_Var18->_M_left)[(char)uVar3 < cVar6];
              } while ((&p_Var18->_M_left)[(char)uVar3 < cVar6] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var23 != &local_190._M_impl.super__Rb_tree_header) {
                if ((char)uVar3 < cVar6) {
                  p_Var18 = p_Var22;
                }
                if ((char)p_Var18[1]._M_color <= cVar6) {
                  cVar6 = (**(code **)(*(long *)p_Var23[1]._M_parent + 0x10))();
                  ppcVar21 = local_1c0;
                  p_Var23 = p_Var23[1]._M_parent;
                  if (cVar6 == '\0') {
                    local_158 = 0;
                    local_160 = &local_190;
                    local_148 = Catch::clara::std::
                                _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                                ::_M_invoke;
                    local_150 = Catch::clara::std::
                                _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                                ::_M_manager;
                    bVar7 = (**(code **)(*(long *)p_Var23 + 0x18))
                                      (p_Var23,iVar24,local_1c0,&local_1ec,2,&local_160);
                    this->failed = (bool)(this->failed | bVar7 ^ 1);
                    if (local_150 != (code *)0x0) {
                      (*local_150)(&local_160,&local_160,3);
                    }
                  }
                  else {
                    local_118 = 0;
                    local_120 = &local_190;
                    local_108 = Catch::clara::std::
                                _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                                ::_M_invoke;
                    local_110 = Catch::clara::std::
                                _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                                ::_M_manager;
                    (**(code **)(*(long *)p_Var23 + 0x18))
                              (p_Var23,iVar24,local_1c0,&local_1ec,0,&local_120);
                    if (local_110 != (code *)0x0) {
                      (*local_110)(&local_120,&local_120,3);
                    }
                    cVar6 = ppcVar21[(int)local_1ec][1];
                    if (cVar6 != '\0') {
                      lVar13 = 1;
                      do {
                        local_1b8 = lVar13;
                        iVar8 = isprint((int)cVar6);
                        local_1e0._M_dataplus._M_p._0_1_ = cVar6;
                        if ((cVar6 == '-') || (iVar8 == 0)) {
                          this->failed = true;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"error: invalid character\'",0x19);
                          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cerr,(char *)&local_1e0,1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15," ignoring ",10);
                          pcVar29 = ppcVar21[(int)local_1ec] + local_1b8;
                          sVar16 = strlen(pcVar29);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar29,sVar16)
                          ;
                          local_1e0._M_dataplus._M_p._0_1_ = 10;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,(char *)&local_1e0,1);
                          break;
                        }
                        if (local_190._M_impl.super__Rb_tree_header._M_header._M_parent ==
                            (_Base_ptr)0x0) {
LAB_00115936:
                          this->failed = true;
                          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                          std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x01');
                          plVar14 = (long *)std::__cxx11::string::replace
                                                      ((ulong)&local_1e0,0,(char *)0x0,0x189c6b);
                          iVar24 = local_1e4;
                          psVar19 = (size_type *)(plVar14 + 2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*plVar14 ==
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)psVar19) {
                            local_1b0.field_2._M_allocated_capacity = *psVar19;
                            local_1b0.field_2._8_8_ = plVar14[3];
                            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                          }
                          else {
                            local_1b0.field_2._M_allocated_capacity = *psVar19;
                            local_1b0._M_dataplus._M_p = (pointer)*plVar14;
                          }
                          local_1b0._M_string_length = plVar14[1];
                          *plVar14 = (long)psVar19;
                          plVar14[1] = 0;
                          *(undefined1 *)(plVar14 + 2) = 0;
                          unrecognized_option(this,&local_1b0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                            operator_delete(local_1b0._M_dataplus._M_p,
                                            local_1b0.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                            operator_delete(local_1e0._M_dataplus._M_p,
                                            CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                                     local_1e0.field_2._M_local_buf[0]) + 1);
                          }
                        }
                        else {
                          p_Var23 = &local_190._M_impl.super__Rb_tree_header._M_header;
                          p_Var4 = local_190._M_impl.super__Rb_tree_header._M_header._M_parent;
                          do {
                            p_Var18 = p_Var4;
                            p_Var22 = p_Var23;
                            uVar3 = (undefined1)p_Var18[1]._M_color;
                            p_Var23 = p_Var18;
                            if ((char)uVar3 < cVar6) {
                              p_Var23 = p_Var22;
                            }
                            p_Var4 = (&p_Var18->_M_left)[(char)uVar3 < cVar6];
                          } while ((&p_Var18->_M_left)[(char)uVar3 < cVar6] != (_Base_ptr)0x0);
                          if ((_Rb_tree_header *)p_Var23 == &local_190._M_impl.super__Rb_tree_header
                             ) goto LAB_00115936;
                          if ((char)uVar3 < cVar6) {
                            p_Var18 = p_Var22;
                          }
                          if (cVar6 < (char)p_Var18[1]._M_color) goto LAB_00115936;
                          cVar6 = (**(code **)(*(long *)p_Var23[1]._M_parent + 0x10))();
                          iVar24 = local_1e4;
                          if (cVar6 == '\0') {
                            this->failed = true;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,
                                       "error: non-void options not allowed in option packs; ignoring "
                                       ,0x3e);
                            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,(char *)&local_1e0,1);
                            local_1e0._M_dataplus._M_p._0_1_ = 10;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,(char *)&local_1e0,1);
                            iVar24 = local_1e4;
                          }
                          else {
                            local_138 = 0;
                            local_140 = &local_190;
                            local_128 = Catch::clara::std::
                                        _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                                        ::_M_invoke;
                            local_130 = Catch::clara::std::
                                        _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                                        ::_M_manager;
                            (**(code **)(*(long *)p_Var23[1]._M_parent + 0x18))
                                      (p_Var23[1]._M_parent,local_1e4,ppcVar21,&local_1ec,0,
                                       &local_140);
                            if (local_130 != (code *)0x0) {
                              (*local_130)(&local_140,&local_140,3);
                            }
                          }
                        }
                        cVar6 = ppcVar21[(int)local_1ec][local_1b8 + 1];
                        lVar13 = local_1b8 + 1;
                      } while (cVar6 != '\0');
                    }
                  }
                  goto LAB_00115509;
                }
              }
            }
            this->failed = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,pcVar29,(allocator<char> *)&local_1e0);
            unrecognized_option(this,&local_c0);
            ppcVar21 = local_1c0;
            uVar26 = local_c0.field_2._M_allocated_capacity;
            _Var27._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_00115501;
            goto LAB_00115509;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e0,pcVar29,&local_1e5);
          p_Var11 = (_List_node_base *)operator_new(0x30);
          goto LAB_0011549c;
        }
        cVar6 = pcVar29[2];
        if (cVar6 != '\0') {
          lVar25 = -2;
          lVar13 = 3;
          while ((cVar6 != '\0' && (cVar6 != '='))) {
            pcVar2 = pcVar29 + lVar13;
            lVar25 = lVar25 + -1;
            lVar13 = lVar13 + 1;
            cVar6 = *pcVar2;
          }
          if (lVar25 != -2) {
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e0,pcVar29 + 2,(long)pcVar29 - lVar25);
            iVar12 = Catch::clara::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                     ::find(&local_60,&local_1e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                       local_1e0.field_2._M_local_buf[0]) + 1);
            }
            iVar24 = local_1e4;
            if ((_Rb_tree_header *)iVar12._M_node == &local_60._M_impl.super__Rb_tree_header) {
              this->failed = true;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a0,ppcVar21[(int)local_1ec],(allocator<char> *)&local_1e0)
              ;
              unrecognized_option(this,&local_a0);
              uVar26 = local_a0.field_2._M_allocated_capacity;
              _Var27._M_p = local_a0._M_dataplus._M_p;
              iVar24 = local_1e4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_00115501;
            }
            else {
              local_f8 = 0;
              local_100 = &local_190;
              local_e8 = Catch::clara::std::
                         _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                         ::_M_invoke;
              local_f0 = Catch::clara::std::
                         _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/opts.h:388:21)>
                         ::_M_manager;
              bVar7 = (**(code **)(**(long **)(iVar12._M_node + 2) + 0x18))
                                (*(long **)(iVar12._M_node + 2),local_1e4,ppcVar21,&local_1ec,
                                 ((int)pcVar29 - *(int *)(ppcVar21 + (int)local_1ec)) - (int)lVar25,
                                 &local_100);
              this->failed = (bool)(this->failed | bVar7 ^ 1);
              if (local_f0 != (code *)0x0) {
                (*local_f0)(&local_100,&local_100,3);
              }
            }
            goto LAB_00115509;
          }
          this->failed = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,pcVar29,(allocator<char> *)&local_1e0);
          unrecognized_option(this,&local_80);
          uVar26 = local_80.field_2._M_allocated_capacity;
          _Var27._M_p = local_80._M_dataplus._M_p;
          iVar24 = local_1e4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00115509;
          goto LAB_00115501;
        }
        while (local_1ec = (int)uVar17 + 1, (int)local_1ec < iVar24) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e0,ppcVar21[(int)local_1ec],&local_1e5);
          paVar28 = &local_1e0.field_2;
          p_Var11 = (_List_node_base *)operator_new(0x30);
          p_Var11[1]._M_next = p_Var11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p == paVar28) {
            p_Var11[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                          local_1e0.field_2._M_local_buf[0]);
            p_Var11[2]._M_prev = (_List_node_base *)local_1e0.field_2._8_8_;
          }
          else {
            p_Var11[1]._M_next = (_List_node_base *)local_1e0._M_dataplus._M_p;
            p_Var11[2]._M_next =
                 (_List_node_base *)
                 CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                          local_1e0.field_2._M_local_buf[0]);
          }
          p_Var11[1]._M_prev = (_List_node_base *)local_1e0._M_string_length;
          local_1e0._M_string_length = 0;
          local_1e0.field_2._M_local_buf[0] = '\0';
          local_1e0._M_dataplus._M_p = (pointer)paVar28;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          psVar1 = &(this->args).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != paVar28) {
            operator_delete(local_1e0._M_dataplus._M_p,
                            CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                     local_1e0.field_2._M_local_buf[0]) + 1);
          }
          uVar17 = (ulong)local_1ec;
        }
      }
      else {
LAB_0011547d:
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar29,&local_1e5);
        p_Var11 = (_List_node_base *)operator_new(0x30);
LAB_0011549c:
        paVar28 = &local_1e0.field_2;
        p_Var11[1]._M_next = p_Var11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p == paVar28) {
          p_Var11[2]._M_next =
               (_List_node_base *)
               CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                        local_1e0.field_2._M_local_buf[0]);
          p_Var11[2]._M_prev = (_List_node_base *)local_1e0.field_2._8_8_;
        }
        else {
          p_Var11[1]._M_next = (_List_node_base *)local_1e0._M_dataplus._M_p;
          p_Var11[2]._M_next =
               (_List_node_base *)
               CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                        local_1e0.field_2._M_local_buf[0]);
        }
        p_Var11[1]._M_prev = (_List_node_base *)local_1e0._M_string_length;
        local_1e0._M_string_length = 0;
        local_1e0.field_2._M_local_buf[0] = '\0';
        local_1e0._M_dataplus._M_p = (pointer)paVar28;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar1 = &(this->args).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != paVar28) {
          uVar26 = CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                            local_1e0.field_2._M_local_buf[0]);
          _Var27._M_p = local_1e0._M_dataplus._M_p;
LAB_00115501:
          operator_delete(_Var27._M_p,uVar26 + 1);
        }
      }
LAB_00115509:
      local_1ec = local_1ec + 1;
    } while ((int)local_1ec < iVar24);
  }
  bVar5 = this->failed;
  Catch::clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  ::~_Rb_tree(&local_60);
  Catch::clara::std::
  _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  ::~_Rb_tree(&local_190);
  return (bool)(bVar5 ^ 1);
}

Assistant:

bool
Options::parse(int argc, char** argv)
{
    std::map<char, BasicOption*>                    short_opts;
    std::map<std::string, BasicOption*>             long_opts;

    for (auto& opt : options)
    {
        if (opt->s)
            short_opts[opt->s] = opt.get();

        long_opts[opt->l] = opt.get();
    }

    auto is_short = [&short_opts](char c) -> bool   { return short_opts.find(c) != short_opts.end(); };

    for (int i = 1; i < argc; ++i)
    {
        if( argv[ i ][ 0 ] == '\0' )
            continue;
        if( argv[ i ][ 0 ] != '-' || dashed_non_option(argv[i], is_short))
            args.push_back(argv[i]);
        else
        {
            // -...
            if( argv[ i ][ 1 ] == '\0' )
            {
                // -
                args.push_back(argv[i]);
            } else if( argv[ i ][ 1 ] == '-' )
            {
                if( argv[ i ][ 2 ] == '\0' )
                {
                    // --
                    while( ++i < argc )
                        args.push_back(argv[i]);
                } else {
                    // --...
                    char* first = &argv[ i ][ 2 ];
                    char* last = first;
                    for(; *last != '=' && *last != '\0'; ++last);
                    if (first == last)
                    {
                        failed = true;
                        unrecognized_option(argv[i]);
                    } else
                    {
                        auto opt_it = long_opts.find(std::string{first,last});
                        if (opt_it == long_opts.end())
                        {
                            failed = true;
                            unrecognized_option(argv[i]);
                        } else
                        {
                            failed |= !opt_it->second->parse(argc, argv, i, static_cast<int>(last - argv[i]), is_short);
                        }
                    }
                }
            } else
            {
                // -f...
                auto opt_it = short_opts.find(argv[i][1]);
                if (opt_it == short_opts.end())
                {
                    failed = true;
                    unrecognized_option(argv[i]);
                } else if (opt_it->second->flag())
                {
                    opt_it->second->parse(argc, argv, i, 0, is_short);      // arguments are meaningless; just sets the flag

                    // -fgh
                    char c;
                    for(int j = 1; (c = argv[i][j]) != '\0'; ++j)
                    {
                        if (!std::isprint(c) || c == '-')
                        {
                            failed = true;
                            std::cerr << "error: invalid character\'" << c << " ignoring " << &argv[i][j] << '\n';
                            break;
                        }
                        opt_it = short_opts.find(c);
                        if (opt_it == short_opts.end())
                        {
                            failed = true;
                            unrecognized_option("-" + std::string(1, c));
                            continue;
                        }
                        if (!opt_it->second->flag())
                        {
                            failed = true;
                            std::cerr << "error: non-void options not allowed in option packs; ignoring " << c << '\n';
                            continue;
                        }
                        opt_it->second->parse(argc, argv, i, 0, is_short);     // arguments are meaningless; just sets the flag
                    }
                } else
                {
                    failed |= !opt_it->second->parse(argc, argv, i, 2, is_short);
                }
            }
        }
    }

    return !failed;
}